

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCppFile.h
# Opt level: O1

string * __thiscall
cppforth::Forth::GetFileName
          (string *__return_storage_ptr__,Forth *this,Cell handler,string *function,errorCodes ec)

{
  pointer pFVar1;
  pointer pcVar2;
  bool bVar3;
  char cVar4;
  pointer pFVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  pFVar1 = (this->OpenFiles).
           super__Vector_base<cppforth::Forth::ForthFile,_std::allocator<cppforth::Forth::ForthFile>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pFVar5 = (this->OpenFiles).
                super__Vector_base<cppforth::Forth::ForthFile,_std::allocator<cppforth::Forth::ForthFile>_>
                ._M_impl.super__Vector_impl_data._M_start; bVar3 = pFVar5 == pFVar1, !bVar3;
      pFVar5 = pFVar5 + 1) {
    if ((pFVar5->FILE == handler) && (cVar4 = std::__basic_file<char>::is_open(), cVar4 != '\0'))
    goto LAB_00126960;
  }
  do {
    __return_storage_ptr__ = &local_50;
    std::operator+(__return_storage_ptr__,function,": wrong file handler access");
    throwMessage(this,__return_storage_ptr__,ec);
    std::__cxx11::string::~string((string *)&local_50);
    __cxa_rethrow();
LAB_00126960:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = (pFVar5->fileName)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar2,pcVar2 + (pFVar5->fileName)._M_string_length)
    ;
  } while (bVar3);
  return __return_storage_ptr__;
}

Assistant:

std::string GetFileName(Cell handler, const std::string& function, errorCodes ec = errorAbort) {
	for (auto it = OpenFiles.begin(); it != OpenFiles.end(); ++it) {
		if ((*it).FILE == handler && (*it).fileObject->is_open()) {
			return (*it).fileName;
		}
	}
	throwMessage(function + ": wrong file handler access", ec);
	throw;
}